

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockExpectedCall_callWithConstPointerParameter_TestShell::createTest
          (TEST_MockExpectedCall_callWithConstPointerParameter_TestShell *this)

{
  TEST_MockExpectedCall_callWithConstPointerParameter_Test *this_00;
  TEST_MockExpectedCall_callWithConstPointerParameter_TestShell *this_local;
  
  this_00 = (TEST_MockExpectedCall_callWithConstPointerParameter_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                         ,0x12f);
  TEST_MockExpectedCall_callWithConstPointerParameter_Test::
  TEST_MockExpectedCall_callWithConstPointerParameter_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockExpectedCall, callWithConstPointerParameter)
{
    const SimpleString paramName = "paramName";
    const void* value = (const void*) 0x345;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("const void*", call->getInputParameterType(paramName).asCharString());
    POINTERS_EQUAL(value, call->getInputParameter(paramName).getConstPointerValue());
    STRCMP_CONTAINS("funcName -> const void* paramName: <0x345>", call->callToString().asCharString());
}